

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O2

void __thiscall EefcFlash::eraseAll(EefcFlash *this,uint32_t offset)

{
  uint uVar1;
  uint32_t uVar2;
  undefined8 *puVar3;
  uint uVar4;
  ulong uVar5;
  
  if (offset == 0) {
    waitFSR(this,1);
    writeFCR0(this,'\x05',0);
    if ((this->super_Flash)._planes == 2) {
      waitFSR(this,1);
      writeFCR1(this,'\x05',0);
    }
    waitFSR(this,0x1e);
    return;
  }
  uVar1 = (this->super_Flash)._size;
  if (offset % (uVar1 * 8) == 0) {
    uVar5 = (ulong)offset / (ulong)uVar1;
    while( true ) {
      uVar1 = (this->super_Flash)._pages;
      uVar4 = (uint)uVar5;
      if (uVar1 <= uVar4) break;
      uVar2 = (this->super_Flash)._planes;
      waitFSR(this,1);
      if ((uVar4 < uVar1 >> 1) || (uVar2 == 1)) {
        writeFCR0(this,'\a',uVar4 | 1);
      }
      else {
        writeFCR1(this,'\a',(uint)(uVar5 % (ulong)((this->super_Flash)._pages >> 1)) | 1);
      }
      uVar5 = (ulong)(uVar4 + 8);
    }
    return;
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = &PTR__exception_00117778;
  __cxa_throw(puVar3,&FlashEraseError::typeinfo,std::exception::~exception);
}

Assistant:

void
EefcFlash::eraseAll(uint32_t offset)
{
    // Do a full chip erase if the offset is 0
    if (offset == 0)
    {
        waitFSR();
        writeFCR0(EEFC_FCMD_EA, 0);
        if (_planes == 2)
        {
            waitFSR();
            writeFCR1(EEFC_FCMD_EA, 0);
        }

        // Erase all can take an exceptionally long time on some devices
        // so wait on FSR for up to 30 seconds
        waitFSR(30);
    }
    // Else we must do it by pages
    else
    {
        // Offset must be on an erase page boundary
        if (offset % (_size * PagesPerErase))
            throw FlashEraseError();

        // Erase each PagesPerErase set of pages
        for (uint32_t pageNum = offset / _size; pageNum < _pages; pageNum += PagesPerErase)
        {
            if (_planes == 1 || pageNum < _pages / 2)
            {
                waitFSR();
                writeFCR0(EEFC_FCMD_EPA, pageNum | 0x1);
            }
            else
            {
                waitFSR();
                writeFCR1(EEFC_FCMD_EPA, (pageNum % (_pages / 2)) | 0x1);
            }
        }
    }
}